

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

void nhdp_db_neighbor_connect_dualstack(nhdp_neighbor *n_ipv4,nhdp_neighbor *n_ipv6)

{
  nhdp_neighbor *pnVar1;
  
  pnVar1 = n_ipv4->dualstack_partner;
  if (pnVar1 != n_ipv6) {
    if (pnVar1 != (nhdp_neighbor *)0x0) {
      pnVar1->dualstack_partner = (nhdp_neighbor *)0x0;
    }
    n_ipv4->dualstack_partner = n_ipv6;
  }
  pnVar1 = n_ipv6->dualstack_partner;
  if (pnVar1 != n_ipv4) {
    if (pnVar1 != (nhdp_neighbor *)0x0) {
      pnVar1->dualstack_partner = (nhdp_neighbor *)0x0;
    }
    n_ipv6->dualstack_partner = n_ipv4;
  }
  return;
}

Assistant:

void
nhdp_db_neighbor_connect_dualstack(struct nhdp_neighbor *n_ipv4, struct nhdp_neighbor *n_ipv6) {
  if (n_ipv4->dualstack_partner != n_ipv6) {
    nhdp_db_neigbor_disconnect_dualstack(n_ipv4);
    n_ipv4->dualstack_partner = n_ipv6;
  }

  if (n_ipv6->dualstack_partner != n_ipv4) {
    nhdp_db_neigbor_disconnect_dualstack(n_ipv6);
    n_ipv6->dualstack_partner = n_ipv4;
  }
}